

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFunctionCommand.h
# Opt level: O0

cmCommand * __thiscall cmFunctionCommand::Clone(cmFunctionCommand *this)

{
  cmCommand *this_00;
  cmFunctionCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x30);
  cmFunctionCommand((cmFunctionCommand *)this_00);
  return this_00;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmFunctionCommand; }